

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O3

bool DivisionCornerCaseHelper<signed_char,_unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_1>
     ::DivisionCornerCase1
               (uint lhs,
               SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               rhs,SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                   *result)

{
  ulong uVar1;
  uint uVar2;
  char cVar3;
  
  if (rhs.m_int < '\x01') {
    if (rhs.m_int == '\0') {
      safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnDivZero();
    }
    uVar1 = (ulong)lhs / (ulong)((byte)~rhs.m_int + 1);
    uVar2 = (uint)uVar1;
    if (uVar2 < 0x80) {
      cVar3 = -(char)uVar1;
    }
    else {
      cVar3 = -0x80;
      if (uVar2 != 0x80) goto LAB_00111294;
    }
  }
  else {
    cVar3 = (char)((ulong)lhs / (ulong)(byte)rhs.m_int);
    if (0x7f < (uint)((ulong)lhs / (ulong)(byte)rhs.m_int)) {
LAB_00111294:
      safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
    }
  }
  result->m_int = cVar3;
  return true;
}

Assistant:

static bool DivisionCornerCase1( U lhs, SafeInt< T, E > rhs, SafeInt<T, E>& result ) SAFEINT_CPP_THROW
    {
        if( (T)rhs > 0 )
        {
            result = SafeInt< T, E >( lhs/(T)rhs );
            return true;
        }

        // Now rhs is either negative, or zero
        if( (T)rhs != 0 )
        {
            if( DivisionNegativeCornerCaseHelper< T, U, E, sizeof( U ) >= 4 && sizeof( T ) <= sizeof( U ) >::NegativeCornerCase( lhs, rhs, result ) )
                return true;

            result = SafeInt< T, E >(lhs/(T)rhs);
            return true;
        }

        E::SafeIntOnDivZero();
    }